

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

char * stb_duplower(char *s)

{
  char cVar1;
  char *pcVar2;
  __int32_t **pp_Var3;
  char *pcVar4;
  
  pcVar2 = strdup(s);
  for (pcVar4 = pcVar2; cVar1 = *pcVar4, (long)cVar1 != 0; pcVar4 = pcVar4 + 1) {
    pp_Var3 = __ctype_tolower_loc();
    *pcVar4 = (char)(*pp_Var3)[cVar1];
  }
  return pcVar2;
}

Assistant:

char *stb_duplower(char *s)
{
   char *p = strdup(s), *q = p;
   while (*q) {
      *q = tolower(*q);
      ++q;
   }
   return p;
}